

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

AverageLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_average(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xf0) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xf0;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    AverageLayerParams::AverageLayerParams(this_00.average_);
    (this->layer_).average_ = (AverageLayerParams *)this_00;
  }
  return (AverageLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::AverageLayerParams* NeuralNetworkLayer::mutable_average() {
  if (!has_average()) {
    clear_layer();
    set_has_average();
    layer_.average_ = new ::CoreML::Specification::AverageLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.average)
  return layer_.average_;
}